

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

int __thiscall
baryonyx::itm::compute_order::
run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>
          (compute_order *this,
          solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
          *solver,bit_array *x,random_engine *rng,float kappa,float delta,float theta)

{
  random_engine *prVar1;
  bit_array *pbVar2;
  iterator iVar3;
  iterator iVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  iterator iVar9;
  iterator iVar10;
  undefined1 local_58 [20];
  undefined4 local_44;
  byte local_3d;
  int remaining;
  float fStack_38;
  bool pi_changed;
  float theta_local;
  float delta_local;
  float kappa_local;
  random_engine *rng_local;
  bit_array *x_local;
  solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
  *solver_local;
  compute_order *this_local;
  
  local_3d = 0;
  local_44 = 0;
  remaining = (int)theta;
  fStack_38 = delta;
  theta_local = kappa;
  _delta_local = rng;
  rng_local = (random_engine *)x;
  x_local = (bit_array *)solver;
  solver_local = (solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                  *)this;
  switch(this->order) {
  case none:
  default:
    iVar9 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar10 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                *)solver,x,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar10._M_current,
               theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case reversing:
    std::vector<int,_std::allocator<int>_>::crbegin
              ((vector<int,_std::allocator<int>_> *)(local_58 + 8));
    std::vector<int,_std::allocator<int>_>::crend((vector<int,_std::allocator<int>_> *)local_58);
    solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
    ::
    compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
              ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                *)solver,x,
               (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)(local_58 + 8),
               (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)local_58,theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case random_sorting:
    iVar9 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar10 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar10._M_current,
               _delta_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    iVar9 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar10 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar10._M_current,
               theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case infeasibility_decr:
    iVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      (&this->m_order);
    iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      (&this->m_order);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,baryonyx::itm::compute_order::run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float)::_lambda(auto:1_const&,auto:2_const&)_1_>
              (iVar3._M_current,iVar4._M_current);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cbegin
                      (&this->m_order);
    cVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cend
                      (&this->m_order);
    solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar5._M_current,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar6._M_current,theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   (this,(solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)x_local,(bit_array *)rng_local);
    break;
  case infeasibility_incr:
    iVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                      (&this->m_order);
    iVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      (&this->m_order);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,baryonyx::itm::compute_order::run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float)::_lambda(auto:1_const&,auto:2_const&)_2_>
              (iVar3._M_current,iVar4._M_current);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar5 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cbegin
                      (&this->m_order);
    cVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::cend
                      (&this->m_order);
    solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar5._M_current,
               (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )cVar6._M_current,theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         infeasibility_local_compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   (this,(solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)x_local,(bit_array *)rng_local);
    break;
  case lagrangian_decr:
    iVar9 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar10 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,baryonyx::itm::compute_order::run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float)::_lambda(auto:1,auto:2)_1_>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar10._M_current,
               (anon_class_8_1_6bb05151)x_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar7 = std::vector<int,_std::allocator<int>_>::cbegin(&this->R);
    cVar8 = std::vector<int,_std::allocator<int>_>::cend(&this->R);
    solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar7._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar8._M_current,theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case lagrangian_incr:
    iVar9 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar10 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,baryonyx::itm::compute_order::run<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array,float>(baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,float,float,float)::_lambda(auto:1,auto:2)_2_>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar10._M_current,
               (anon_class_8_1_6bb05151)x_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    cVar7 = std::vector<int,_std::allocator<int>_>::cbegin(&this->R);
    cVar8 = std::vector<int,_std::allocator<int>_>::cend(&this->R);
    solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
    ::
    compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                *)pbVar2,(bit_array *)prVar1,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar7._M_current,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               cVar8._M_current,theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   ((solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                     *)x_local,(bit_array *)rng_local,&this->R);
    break;
  case pi_sign_change:
    iVar9 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar10 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    std::
    shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar10._M_current,
               _delta_local);
    pbVar2 = x_local;
    prVar1 = rng_local;
    iVar9 = std::vector<int,_std::allocator<int>_>::begin(&this->R);
    iVar10 = std::vector<int,_std::allocator<int>_>::end(&this->R);
    local_3d = solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
               ::
               compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                         ((solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>
                           *)pbVar2,(bit_array *)prVar1,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          iVar9._M_current,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                          iVar10._M_current,theta_local,fStack_38,(float)remaining);
    this_local._4_4_ =
         local_compute_violated_constraints<baryonyx::itm::solver_equalities_01coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,true>,baryonyx::bit_array>
                   (this,(solver_equalities_01coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_true>
                          *)x_local,(bit_array *)rng_local);
    if (((local_3d & 1) == 0) && (this_local._4_4_ == 0)) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int run(Solver& solver,
            Xtype& x,
            random_engine& rng,
            Float kappa,
            Float delta,
            Float theta)
    {
        bool pi_changed = false;
        int remaining = 0;

        switch (order) {
        case solver_parameters::constraint_order::reversing:
            solver.compute_update_row(
              x, R.crbegin(), R.crend(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::random_sorting:
            std::shuffle(R.begin(), R.end(), rng);

            solver.compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::infeasibility_decr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return rhs.second < lhs.second;
                      });
            solver.compute_update_row(
              x, m_order.cbegin(), m_order.cend(), kappa, delta, theta);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::infeasibility_incr:
            std::sort(m_order.begin(),
                      m_order.end(),
                      [](const auto& lhs, const auto& rhs) {
                          return lhs.second < rhs.second;
                      });
            solver.compute_update_row(
              x, m_order.cbegin(), m_order.cend(), kappa, delta, theta);

            return infeasibility_local_compute_violated_constraints(solver, x);
        case solver_parameters::constraint_order::lagrangian_decr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[rhs] < solver.pi[lhs];
              });
            solver.compute_update_row(
              x, R.cbegin(), R.cend(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::lagrangian_incr:
            std::sort(
              R.begin(), R.end(), [&solver](const auto lhs, const auto rhs) {
                  return solver.pi[lhs] < solver.pi[rhs];
              });

            solver.compute_update_row(
              x, R.cbegin(), R.cend(), kappa, delta, theta);

            return compute_violated_constraints(solver, x, R);
        case solver_parameters::constraint_order::pi_sign_change:
            std::shuffle(R.begin(), R.end(), rng);

            pi_changed = solver.compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta);
            remaining = local_compute_violated_constraints(solver, x);

            if (!pi_changed && remaining == 0)
                return 0;

            return remaining;
        case solver_parameters::constraint_order::none:
        default:
            solver.compute_update_row(
              x, R.begin(), R.end(), kappa, delta, theta);
            return compute_violated_constraints(solver, x, R);
        }
    }